

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O1

void dbgent(dbgcxdef *ctx,runsdef *bp,objnum self,objnum target,prpnum prop,int binum,int argc)

{
  int iVar1;
  char buf [128];
  char *local_c0;
  char local_b8 [136];
  
  ctx->dbgcxdep = ctx->dbgcxdep + 1;
  if (ctx->dbgcxfcn == 100) {
    ctx->dbgcxfcn = 99;
    memmove(ctx->dbgcxfrm,ctx->dbgcxfrm + 1,0xc60);
  }
  iVar1 = ctx->dbgcxfcn;
  ctx->dbgcxfcn = iVar1 + 1;
  ctx->dbgcxfrm[iVar1].dbgfbp = bp;
  ctx->dbgcxfrm[iVar1].dbgfself = self;
  ctx->dbgcxfrm[iVar1].dbgftarg = target;
  ctx->dbgcxfrm[iVar1].dbgfprop = prop;
  ctx->dbgcxfrm[iVar1].dbgfbif = binum;
  ctx->dbgcxfrm[iVar1].dbgfargc = argc;
  ctx->dbgcxfrm[iVar1].dbgffr = 0;
  ctx->dbgcxfrm[iVar1].dbgflin = 0;
  if ((ctx->dbgcxflg & 0x20) != 0) {
    local_c0 = local_b8;
    dbgstktr(ctx,dbgent1,&local_c0,-1,1,0);
    iVar1 = (int)local_c0 - (int)local_b8;
    if (0 < iVar1) {
      iVar1 = iVar1 - (uint)(local_b8[iVar1 - 1] == '\n');
    }
    local_b8[iVar1] = '\0';
    dbgaddhist(ctx,local_b8,iVar1 + 1);
  }
  return;
}

Assistant:

void dbgent(dbgcxdef *ctx, runsdef *bp, objnum self, objnum target,
            prpnum prop, int binum, int argc)
{
    dbgfdef *p;
    
    ++(ctx->dbgcxdep);                            /* increment actual depth */
    if (ctx->dbgcxfcn == DBGMAXFRAME)
    {
        --(ctx->dbgcxfcn);                             /* back to top frame */
        memmove(ctx->dbgcxfrm, ctx->dbgcxfrm + 1,
                (size_t)((DBGMAXFRAME - 1) * sizeof(dbgfdef)));
    }
    p = &ctx->dbgcxfrm[ctx->dbgcxfcn];
    ++(ctx->dbgcxfcn);                           /* increment frame pointer */

    p->dbgfbp = bp;
    p->dbgfself = self;
    p->dbgftarg = target;
    p->dbgfprop = prop;
    p->dbgfbif  = binum;
    p->dbgfargc = argc;
    p->dbgffr = 0;                        /* no frame has yet been recorded */
    p->dbgflin = 0;

    /* save call history */
    if (ctx->dbgcxflg & DBGCXFTRC)
    {
        char  buf[128];
        char *p;
        int   l;

        p = buf;
        dbgstktr(ctx, dbgent1, &p, -1, TRUE, FALSE);
        if ((l = (p - buf)) > 0 && buf[l-1] == '\n') --l;
        buf[l++] = '\0';
        dbgaddhist(ctx, buf, l);
    }
}